

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StdPluginLib.h
# Opt level: O1

ExtensionPtr __thiscall
plugin::StdPluginLib::GetExtension(StdPluginLib *this,InterfaceId *interface)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 *puVar2;
  long *plVar3;
  pointer psVar4;
  char cVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var6;
  undefined8 *puVar7;
  bool bVar8;
  ExtensionPtr EVar9;
  long *local_50 [2];
  long local_40 [2];
  
  puVar7 = (undefined8 *)(interface->m_name)._M_string_length;
  puVar2 = (undefined8 *)(interface->m_name).field_2._M_allocated_capacity;
  bVar8 = puVar7 == puVar2;
  _Var6._M_pi = in_RDX;
  if (!bVar8) {
    do {
      plVar3 = (long *)*puVar7;
      local_50[0] = local_40;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_50,in_RDX->_vptr__Sp_counted_base,
                 *(long *)&in_RDX->_M_use_count + (long)in_RDX->_vptr__Sp_counted_base);
      cVar5 = (**(code **)(*plVar3 + 0x18))(plVar3,(string *)local_50);
      _Var6._M_pi = extraout_RDX;
      if (local_50[0] != local_40) {
        operator_delete(local_50[0],local_40[0] + 1);
        _Var6._M_pi = extraout_RDX_00;
      }
      if (cVar5 != '\0') {
        (this->super_IPluginLib)._vptr_IPluginLib = (_func_int **)*puVar7;
        psVar4 = (pointer)puVar7[1];
        (this->m_extensions).
        super__Vector_base<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
        ._M_impl.super__Vector_impl_data._M_start = psVar4;
        if (psVar4 != (pointer)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            p_Var1 = &(psVar4->
                      super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
            UNLOCK();
          }
          else {
            p_Var1 = &(psVar4->
                      super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>
                      )._M_refcount;
            *(int *)&p_Var1->_M_pi = *(int *)&p_Var1->_M_pi + 1;
          }
        }
        if (!bVar8) goto LAB_00103ad4;
        break;
      }
      puVar7 = puVar7 + 2;
      bVar8 = puVar7 == puVar2;
    } while (!bVar8);
  }
  (this->super_IPluginLib)._vptr_IPluginLib = (_func_int **)0x0;
  (this->m_extensions).
  super__Vector_base<std::shared_ptr<plugin::interfaces::IPluginInterface>,_std::allocator<std::shared_ptr<plugin::interfaces::IPluginInterface>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
LAB_00103ad4:
  EVar9.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = _Var6._M_pi;
  EVar9.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)this;
  return (ExtensionPtr)
         EVar9.super___shared_ptr<plugin::interfaces::IPluginInterface,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

ExtensionPtr const GetExtension(const plugin::InterfaceId& interface) const override
        {
            for(auto const& extension : m_extensions)
            {
                if(extension->RttiMatch(interface))
                {
                    return extension;
                }
            }

            return nullptr;
        }